

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_peer_id.cpp
# Opt level: O2

peer_id * libtorrent::aux::generate_peer_id(peer_id *__return_storage_ptr__,session_settings *sett)

{
  string *psVar1;
  difference_type extraout_RDX;
  span<char> dest;
  string print;
  
  digest32<160L>::clear(__return_storage_ptr__);
  psVar1 = session_settings::get_str_abi_cxx11_(sett,10);
  ::std::__cxx11::string::string((string *)&print,(string *)psVar1);
  if (0x14 < (long)print._M_string_length) {
    ::std::__cxx11::string::resize((ulong)&print);
  }
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,unsigned_char*>
            (print._M_dataplus._M_p,print._M_dataplus._M_p + print._M_string_length,
             (uchar *)__return_storage_ptr__);
  if ((long)print._M_string_length < 0x14) {
    dest.m_ptr = (char *)(0x14 - print._M_string_length);
    dest.m_len = extraout_RDX;
    url_random((aux *)((long)(__return_storage_ptr__->m_number)._M_elems + print._M_string_length),
               dest);
  }
  ::std::__cxx11::string::~string((string *)&print);
  return __return_storage_ptr__;
}

Assistant:

peer_id generate_peer_id(session_settings const& sett)
{
	peer_id ret;
	std::string print = sett.get_str(settings_pack::peer_fingerprint);
	if (std::ptrdiff_t(print.size()) > ret.size())
		print.resize(std::size_t(ret.size()));

	// the client's fingerprint
	std::copy(print.begin(), print.end(), ret.begin());
	if (std::ptrdiff_t(print.size()) < ret.size())
		url_random(span<char>(ret).subspan(std::ptrdiff_t(print.length())));
	return ret;
}